

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_set.c
# Opt level: O1

int mpt_meta_set(mpt_metatype **mptr,mpt_value *val)

{
  mpt_metatype *pmVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  mpt_value *pmVar5;
  int unaff_EBP;
  byte bVar6;
  mpt_config *cfg;
  mpt_object *obj;
  mpt_value local_48;
  mpt_object *local_38;
  
  pmVar5 = &local_48;
  pmVar1 = *mptr;
  if (pmVar1 == (mpt_metatype *)0x0) {
    iVar4 = 0;
    goto LAB_00115c65;
  }
  iVar3 = (*(pmVar1->_vptr->convertable).convert)((mpt_convertable *)pmVar1,0,(void *)0x0);
  iVar4 = 0;
  if (0 < iVar3) {
    iVar4 = iVar3;
  }
  local_38 = (mpt_object *)0x0;
  iVar3 = (*(pmVar1->_vptr->convertable).convert)((mpt_convertable *)pmVar1,0x84,&local_38);
  if (local_38 == (mpt_object *)0x0 || iVar3 < 0) {
LAB_00115c0e:
    local_48._addr = (long *)0x0;
    iVar3 = (*(pmVar1->_vptr->convertable).convert)((mpt_convertable *)pmVar1,0x85,&local_48);
    bVar6 = 1;
    if ((long *)local_48._addr != (long *)0x0 && -1 < iVar3) {
      iVar4 = (**(code **)(*local_48._addr + 8))(local_48._addr,0,val);
      bVar6 = (byte)((uint)iVar4 >> 0x1f);
      if (-1 < iVar4) {
        unaff_EBP = iVar4;
      }
    }
  }
  else {
    if (val == (mpt_value *)0x0) {
      iVar3 = (*local_38->_vptr->set_property)(local_38,(char *)0x0,(mpt_convertable *)0x0);
      bVar6 = (byte)((uint)iVar3 >> 0x1f);
      unaff_EBP = iVar4;
    }
    else {
      local_48._addr = val->_addr;
      local_48._type = val->_type;
      bVar6 = 0;
      unaff_EBP = mpt_object_set_value(local_38,(char *)0x0,&local_48);
      if (-1 < unaff_EBP) {
        unaff_EBP = iVar4;
      }
    }
    if (bVar6 != 0) goto LAB_00115c0e;
    bVar6 = 0;
  }
  if (bVar6 == 0) {
    return unaff_EBP;
  }
LAB_00115c65:
  if (val == (mpt_value *)0x0) {
    local_48._addr = (long *)0x0;
    if (((pmVar1 == (mpt_metatype *)0x0) ||
        (iVar3 = (*(pmVar1->_vptr->convertable).convert)((mpt_convertable *)pmVar1,0x86,&local_48),
        (long *)local_48._addr == (long *)0x0 || iVar3 < 0)) ||
       (iVar3 = (**(code **)(*local_48._addr + 0x10))(), iVar3 < 0)) {
      iVar4 = 0;
      pmVar5 = (mpt_value *)mpt_metatype_default();
      bVar2 = true;
    }
    else {
      bVar2 = false;
      unaff_EBP = iVar4;
    }
    if (!bVar2) {
      return unaff_EBP;
    }
  }
  else {
    pmVar5 = (mpt_value *)mpt_meta_new(val);
    if (pmVar5 == (mpt_value *)0x0) {
      return -4;
    }
    iVar3 = (*(((mpt_metatype *)pmVar5)->_vptr->convertable).convert)
                      ((mpt_convertable *)pmVar5,0,(void *)0x0);
    iVar4 = 0;
    if (0 < iVar3) {
      iVar4 = iVar3;
    }
  }
  if (pmVar1 != (mpt_metatype *)0x0) {
    (*pmVar1->_vptr->unref)(pmVar1);
  }
  *mptr = (mpt_metatype *)pmVar5;
  return iVar4;
}

Assistant:

extern int mpt_meta_set(MPT_INTERFACE(metatype) **mptr, const MPT_STRUCT(value) *val)
{
	
	MPT_INTERFACE(metatype) *old, *mt;
	int ret = 0;
	
	if ((old = *mptr)) {
		/* try assign existing data */
		MPT_INTERFACE(object) *obj;
		MPT_INTERFACE(config) *cfg;
		
		if ((ret = MPT_metatype_convert(old, 0, 0)) < 0) {
			ret = 0;
		}
		obj = 0;
		if ((MPT_metatype_convert(old, MPT_ENUM(TypeObjectPtr), &obj)) >= 0
		 && obj) {
			int err;
			if (val) {
				MPT_STRUCT(value) tmp = *val;
				if ((err = mpt_object_set_value(obj, 0, &tmp)) < 0) {
					return err;
				}
				return ret;
			}
			if ((err = obj->_vptr->set_property(obj, 0, 0)) >= 0) {
				return ret;
			}
		}
		cfg = 0;
		if ((MPT_metatype_convert(old, MPT_ENUM(TypeConfigPtr), &cfg)) >= 0
		    && cfg
		    && (ret = cfg->_vptr->assign(cfg, 0, val)) >= 0) {
			return ret;
		}
	}
	/* default config data */
	if (!val) {
		/* try to reset existing iterator */
		MPT_INTERFACE(iterator) *it = 0;
		
		if (old
		    && MPT_metatype_convert(old, MPT_ENUM(TypeIteratorPtr), &it) >= 0
		    && it
		    && it->_vptr->reset(it) >= 0) {
			return ret;
		}
		mt = mpt_metatype_default();
		ret = 0;
	}
	/* create new metatype for data */
	else if (!(mt = mpt_meta_new(val))) {
		return MPT_ERROR(BadOperation);
	}
	else if ((ret = MPT_metatype_convert(mt, 0, 0)) < 0) {
		ret = 0;
	}
	if (old) {
		old->_vptr->unref(old);
	}
	*mptr = mt;
	return ret;
}